

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

UniValue * Parse(string_view raw)

{
  ulong uVar1;
  runtime_error *this;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *parsed;
  UniValue *in_stack_ffffffffffffff78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar2;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  UniValue::UniValue(in_stack_ffffffffffffff78);
  uVar1 = UniValue::read(in_RDI,in_ESI,in_RDX,in_RCX);
  if ((uVar1 & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::basic_string_view<char,std::char_traits<char>>>
              ((char *)CONCAT17(uVar2,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0);
    std::runtime_error::runtime_error(this,local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue Parse(std::string_view raw)
{
    UniValue parsed;
    if (!parsed.read(raw)) throw std::runtime_error(tfm::format("Error parsing JSON: %s", raw));
    return parsed;
}